

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::
 write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,big_decimal_fp *fp,basic_format_specs<char> *specs,float_specs fspecs,
           char decimal_point)

{
  int iVar1;
  size_type sVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  size_t __n;
  ptrdiff_t _Num_1;
  byte *pbVar7;
  ulong uVar8;
  byte *pbVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  size_t n;
  size_t sVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  char *pcVar18;
  uint uVar19;
  ptrdiff_t _Num;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  size_t local_60;
  byte local_58;
  uint local_34;
  
  iVar1 = fp->significand_size;
  sVar13 = (size_t)iVar1;
  uVar3 = fspecs._4_4_;
  uVar19 = uVar3 >> 8 & 0xff;
  uVar8 = (ulong)uVar19;
  uVar11 = (iVar1 + 1) - (uint)(uVar19 == 0);
  uVar12 = (ulong)uVar11;
  pcVar10 = fp->significand;
  uVar15 = fp->exponent;
  local_34 = uVar15 + iVar1;
  iVar4 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_0010ffe8:
    iVar17 = uVar15 + iVar1 + -1;
    if ((uVar3 >> 0x14 & 1) == 0) {
      local_60 = 0;
      if (iVar1 == 1) {
        decimal_point = '\0';
      }
    }
    else {
      local_60 = 0;
      if (0 < iVar4 - iVar1) {
        local_60 = (size_t)(uint)(iVar4 - iVar1);
      }
      uVar12 = uVar12 + local_60;
    }
    iVar4 = 1 - local_34;
    if (0 < (int)local_34) {
      iVar4 = iVar17;
    }
    lVar14 = 2;
    if (99 < iVar4) {
      lVar14 = (ulong)(999 < iVar4) + 3;
    }
    uVar12 = (3 - (ulong)(decimal_point == '\0')) + uVar12 + lVar14;
    local_58 = ((uVar3 >> 0x10 & 1) == 0) << 5;
    uVar5 = (ulong)specs->width;
    if ((long)uVar5 < 1) {
      sVar2 = (out.container)->_M_string_length;
      std::__cxx11::string::resize((ulong)out.container,(char)uVar12 + (char)sVar2);
      pcVar18 = ((out.container)->_M_dataplus)._M_p + sVar2;
      if (uVar19 != 0) {
        *pcVar18 = *(char *)((long)&basic_data<void>::signs + uVar8);
        pcVar18 = pcVar18 + 1;
      }
      *pcVar18 = *pcVar10;
      if (decimal_point == '\0') {
        pbVar7 = (byte *)(pcVar18 + 1);
      }
      else {
        pcVar18[1] = decimal_point;
        if (iVar1 != 1) {
          memmove(pcVar18 + 2,pcVar10 + 1,sVar13 - 1);
        }
        pbVar7 = (byte *)(pcVar18 + 2 + (sVar13 - 1));
      }
      pbVar9 = pbVar7;
      if ((int)local_60 != 0) {
        pbVar9 = pbVar7 + local_60;
        memset(pbVar7,0x30,local_60);
      }
      *pbVar9 = local_58 | 0x45;
      write_exponent<char,char*>(iVar17,(char *)(pbVar9 + 1));
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )out.container;
    }
    local_58 = local_58 | 0x45;
    uVar16 = 0;
    if (uVar12 <= uVar5) {
      uVar16 = uVar5 - uVar12;
    }
    uVar5 = uVar16 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    sVar2 = (out.container)->_M_string_length;
    std::__cxx11::string::resize
              ((ulong)out.container,(char)uVar12 + (char)sVar2 + (specs->fill).size_ * (char)uVar16)
    ;
    pcVar18 = fill<char*,char>(((out.container)->_M_dataplus)._M_p + sVar2,uVar5,&specs->fill);
    if (uVar19 != 0) {
      *pcVar18 = *(char *)((long)&basic_data<void>::signs + uVar8);
      pcVar18 = pcVar18 + 1;
    }
    *pcVar18 = *pcVar10;
    if (decimal_point == '\0') {
      pbVar7 = (byte *)(pcVar18 + 1);
    }
    else {
      pcVar18[1] = decimal_point;
      if (iVar1 != 1) {
        memmove(pcVar18 + 2,pcVar10 + 1,sVar13 - 1);
      }
      pbVar7 = (byte *)(pcVar18 + 2 + (sVar13 - 1));
    }
    pbVar9 = pbVar7;
    if ((int)local_60 != 0) {
      pbVar9 = pbVar7 + local_60;
      memset(pbVar7,0x30,local_60);
    }
    *pbVar9 = local_58;
    pcVar18 = write_exponent<char,char*>(iVar17,(char *)(pbVar9 + 1));
    n = uVar16 - uVar5;
  }
  else {
    if (((ulong)fspecs & 0xff00000000) == 0) {
      iVar17 = 0x10;
      if (0 < iVar4) {
        iVar17 = iVar4;
      }
      if (((int)local_34 < -3) || (iVar17 < (int)local_34)) goto LAB_0010ffe8;
    }
    if ((int)uVar15 < 0) {
      if ((int)local_34 < 1) {
        uVar15 = -local_34;
        __n = (size_t)uVar15;
        if (SBORROW4(iVar4,uVar15) != (int)(iVar4 + local_34) < 0) {
          __n = (ulong)fspecs & 0xffffffff;
        }
        if (iVar1 != 0) {
          __n = (size_t)uVar15;
        }
        if (iVar4 < 0) {
          __n = (size_t)uVar15;
        }
        iVar4 = (int)__n;
        uVar12 = (iVar4 + 2) + uVar12;
        uVar5 = 0;
        if (uVar12 <= (uint)specs->width) {
          uVar5 = (uint)specs->width - uVar12;
        }
        uVar16 = uVar5 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                    (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
        sVar2 = (out.container)->_M_string_length;
        std::__cxx11::string::resize
                  ((ulong)out.container,
                   (char)uVar12 + (char)sVar2 + (specs->fill).size_ * (char)uVar5);
        pcVar6 = fill<char*,char>(((out.container)->_M_dataplus)._M_p + sVar2,uVar16,&specs->fill);
        if (uVar19 != 0) {
          *pcVar6 = *(char *)((long)&basic_data<void>::signs + uVar8);
          pcVar6 = pcVar6 + 1;
        }
        *pcVar6 = '0';
        if ((((ulong)fspecs & 0x10000000000000) == 0 && iVar1 == 0) && iVar4 == 0) {
          pcVar18 = pcVar6 + 1;
        }
        else {
          pcVar6[1] = decimal_point;
          pcVar6 = pcVar6 + 2;
          pcVar18 = pcVar6;
          if (0 < iVar4) {
            pcVar18 = pcVar6 + __n;
            memset(pcVar6,0x30,__n);
          }
          if (iVar1 != 0) {
            memmove(pcVar18,pcVar10,sVar13);
          }
          pcVar18 = pcVar18 + sVar13;
        }
        n = uVar5 - uVar16;
      }
      else {
        uVar15 = iVar4 - iVar1 & (int)(uVar3 << 0xb) >> 0x1f;
        uVar5 = 0;
        if (0 < (int)uVar15) {
          uVar5 = (ulong)uVar15;
        }
        uVar16 = uVar5 + uVar12 + 1;
        uVar12 = 0;
        if (uVar16 <= (uint)specs->width) {
          uVar12 = (uint)specs->width - uVar16;
        }
        uVar16 = uVar12 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                     (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
        sVar2 = (out.container)->_M_string_length;
        std::__cxx11::string::resize
                  ((ulong)out.container,
                   (char)sVar2 + (char)uVar5 + (char)uVar11 + '\x01' +
                   (specs->fill).size_ * (char)uVar12);
        pcVar6 = fill<char*,char>(((out.container)->_M_dataplus)._M_p + sVar2,uVar16,&specs->fill);
        if (uVar19 != 0) {
          *pcVar6 = *(char *)((long)&basic_data<void>::signs + uVar8);
          pcVar6 = pcVar6 + 1;
        }
        uVar8 = (ulong)local_34;
        memmove(pcVar6,pcVar10,uVar8);
        pcVar6 = pcVar6 + uVar8;
        if (decimal_point != '\0') {
          *pcVar6 = decimal_point;
          memmove(pcVar6 + 1,pcVar10 + uVar8,sVar13 - uVar8);
          pcVar6 = pcVar6 + (sVar13 - uVar8) + 1;
        }
        pcVar18 = pcVar6;
        if (0 < (int)uVar15) {
          pcVar18 = pcVar6 + uVar15;
          memset(pcVar6,0x30,(ulong)uVar15);
        }
        n = uVar12 - uVar16;
      }
    }
    else {
      uVar12 = uVar12 + uVar15;
      local_34 = iVar4 - local_34;
      if ((uVar3 >> 0x14 & 1) != 0) {
        uVar15 = 1;
        if (0 < (int)local_34) {
          uVar15 = local_34;
        }
        if (fspecs._4_1_ == '\x02') {
          uVar15 = local_34;
        }
        local_34 = uVar15;
        if (0 < (int)uVar15) {
          uVar12 = uVar12 + uVar15;
        }
      }
      uVar5 = 0;
      if (uVar12 <= (uint)specs->width) {
        uVar5 = (uint)specs->width - uVar12;
      }
      uVar16 = uVar5 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                  (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
      sVar2 = (out.container)->_M_string_length;
      std::__cxx11::string::resize
                ((ulong)out.container,(char)uVar12 + (char)sVar2 + (specs->fill).size_ * (char)uVar5
                );
      pcVar6 = fill<char*,char>(((out.container)->_M_dataplus)._M_p + sVar2,uVar16,&specs->fill);
      if (uVar19 != 0) {
        *pcVar6 = *(char *)((long)&basic_data<void>::signs + uVar8);
        pcVar6 = pcVar6 + 1;
      }
      if (iVar1 != 0) {
        memmove(pcVar6,pcVar10,sVar13);
      }
      pcVar6 = pcVar6 + sVar13;
      sVar13 = (size_t)fp->exponent;
      pcVar18 = pcVar6;
      if (0 < (long)sVar13) {
        pcVar18 = pcVar6 + sVar13;
        memset(pcVar6,0x30,sVar13);
      }
      if ((uVar3 >> 0x14 & 1) != 0) {
        *pcVar18 = decimal_point;
        pcVar10 = pcVar18 + 1;
        pcVar18 = pcVar10;
        if (0 < (int)local_34) {
          pcVar18 = pcVar10 + local_34;
          memset(pcVar10,0x30,(ulong)local_34);
        }
      }
      n = uVar5 - uVar16;
    }
  }
  fill<char*,char>(pcVar18,n,&specs->fill);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}